

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O2

opj_tgt_tree_t *
opj_tgt_init(opj_tgt_tree_t *p_tree,OPJ_UINT32 p_num_leafs_h,OPJ_UINT32 p_num_leafs_v,
            opj_event_mgr_t *p_manager)

{
  opj_tgt_node *poVar1;
  OPJ_UINT32 OVar2;
  opj_tgt_node_t *poVar3;
  ulong uVar4;
  int iVar5;
  opj_tgt_node *poVar6;
  opj_tgt_node *poVar7;
  OPJ_UINT32 OVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  OPJ_INT32 l_nplv [32];
  OPJ_INT32 l_nplh [32];
  
  if (p_tree == (opj_tgt_tree_t *)0x0) {
LAB_00136546:
    p_tree = (opj_tgt_tree_t *)0x0;
  }
  else {
    uVar4 = (ulong)p_num_leafs_v;
    if ((p_tree->numleafsh != p_num_leafs_h) || (p_tree->numleafsv != p_num_leafs_v)) {
      p_tree->numleafsh = p_num_leafs_h;
      p_tree->numleafsv = p_num_leafs_v;
      l_nplh[0] = p_num_leafs_h;
      l_nplv[0] = p_num_leafs_v;
      OVar8 = 0;
      uVar13 = 0xffffffffffffffff;
      OVar2 = p_num_leafs_h;
      do {
        uVar10 = (int)uVar4 * OVar2;
        OVar2 = (int)(OVar2 + 1) / 2;
        uVar12 = (int)uVar13 + 2;
        l_nplh[uVar12] = OVar2;
        uVar4 = (long)((int)uVar4 + 1) / 2;
        l_nplv[uVar12] = (OPJ_INT32)uVar4;
        OVar8 = OVar8 + uVar10;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (1 < uVar10);
      p_tree->numnodes = OVar8;
      if (OVar8 == 0) {
LAB_0013653e:
        opj_tgt_destroy(p_tree);
        goto LAB_00136546;
      }
      uVar10 = OVar8 * 0x18;
      if (p_tree->nodes_size < uVar10) {
        poVar3 = (opj_tgt_node_t *)opj_realloc(p_tree->nodes,(ulong)uVar10);
        if (poVar3 == (opj_tgt_node_t *)0x0) {
          opj_event_msg(p_manager,1,"Not enough memory to reinitialize the tag tree\n");
          goto LAB_0013653e;
        }
        p_tree->nodes = poVar3;
        memset((void *)((long)&poVar3->parent + (ulong)p_tree->nodes_size),0,
               (ulong)(uVar10 - p_tree->nodes_size));
        p_tree->nodes_size = uVar10;
        p_num_leafs_h = p_tree->numleafsh;
        p_num_leafs_v = p_tree->numleafsv;
      }
      poVar3 = p_tree->nodes;
      poVar6 = poVar3 + p_num_leafs_v * p_num_leafs_h;
      poVar7 = poVar6;
      for (uVar4 = 0; uVar4 != uVar13; uVar4 = uVar4 + 1) {
        uVar10 = l_nplv[uVar4];
        uVar9 = 0;
        uVar12 = uVar10;
        if ((int)uVar10 < 1) {
          uVar12 = uVar9;
        }
        for (; uVar9 != uVar12; uVar9 = uVar9 + 1) {
          iVar5 = l_nplh[uVar4];
          lVar11 = (long)iVar5;
          for (; 0 < iVar5; iVar5 = iVar5 + -2) {
            poVar3->parent = poVar7;
            if (iVar5 == 1) {
              poVar3 = poVar3 + 1;
            }
            else {
              poVar3[1].parent = poVar7;
              poVar3 = poVar3 + 2;
            }
            poVar7 = poVar7 + 1;
          }
          poVar1 = poVar7;
          if (uVar9 != uVar10 - 1 && (uVar9 & 1) == 0) {
            poVar7 = poVar6;
            poVar1 = poVar6 + lVar11;
          }
          poVar6 = poVar1;
        }
      }
      poVar3->parent = (opj_tgt_node *)0x0;
    }
    opj_tgt_reset(p_tree);
  }
  return p_tree;
}

Assistant:

opj_tgt_tree_t *opj_tgt_init(opj_tgt_tree_t * p_tree, OPJ_UINT32 p_num_leafs_h,
                             OPJ_UINT32 p_num_leafs_v, opj_event_mgr_t *p_manager)
{
    OPJ_INT32 l_nplh[32];
    OPJ_INT32 l_nplv[32];
    opj_tgt_node_t *l_node = 00;
    opj_tgt_node_t *l_parent_node = 00;
    opj_tgt_node_t *l_parent_node0 = 00;
    OPJ_UINT32 i;
    OPJ_INT32 j, k;
    OPJ_UINT32 l_num_levels;
    OPJ_UINT32 n;
    OPJ_UINT32 l_node_size;

    if (! p_tree) {
        return 00;
    }

    if ((p_tree->numleafsh != p_num_leafs_h) ||
            (p_tree->numleafsv != p_num_leafs_v)) {
        p_tree->numleafsh = p_num_leafs_h;
        p_tree->numleafsv = p_num_leafs_v;

        l_num_levels = 0;
        l_nplh[0] = (OPJ_INT32)p_num_leafs_h;
        l_nplv[0] = (OPJ_INT32)p_num_leafs_v;
        p_tree->numnodes = 0;
        do {
            n = (OPJ_UINT32)(l_nplh[l_num_levels] * l_nplv[l_num_levels]);
            l_nplh[l_num_levels + 1] = (l_nplh[l_num_levels] + 1) / 2;
            l_nplv[l_num_levels + 1] = (l_nplv[l_num_levels] + 1) / 2;
            p_tree->numnodes += n;
            ++l_num_levels;
        } while (n > 1);

        /* ADD */
        if (p_tree->numnodes == 0) {
            opj_tgt_destroy(p_tree);
            return 00;
        }
        l_node_size = p_tree->numnodes * (OPJ_UINT32)sizeof(opj_tgt_node_t);

        if (l_node_size > p_tree->nodes_size) {
            opj_tgt_node_t* new_nodes = (opj_tgt_node_t*) opj_realloc(p_tree->nodes,
                                        l_node_size);
            if (! new_nodes) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Not enough memory to reinitialize the tag tree\n");
                opj_tgt_destroy(p_tree);
                return 00;
            }
            p_tree->nodes = new_nodes;
            memset(((char *) p_tree->nodes) + p_tree->nodes_size, 0,
                   l_node_size - p_tree->nodes_size);
            p_tree->nodes_size = l_node_size;
        }
        l_node = p_tree->nodes;
        l_parent_node = &p_tree->nodes[p_tree->numleafsh * p_tree->numleafsv];
        l_parent_node0 = l_parent_node;

        for (i = 0; i < l_num_levels - 1; ++i) {
            for (j = 0; j < l_nplv[i]; ++j) {
                k = l_nplh[i];
                while (--k >= 0) {
                    l_node->parent = l_parent_node;
                    ++l_node;
                    if (--k >= 0) {
                        l_node->parent = l_parent_node;
                        ++l_node;
                    }
                    ++l_parent_node;
                }
                if ((j & 1) || j == l_nplv[i] - 1) {
                    l_parent_node0 = l_parent_node;
                } else {
                    l_parent_node = l_parent_node0;
                    l_parent_node0 += l_nplh[i];
                }
            }
        }
        l_node->parent = 0;
    }
    opj_tgt_reset(p_tree);

    return p_tree;
}